

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Savepoint.cpp
# Opt level: O1

void __thiscall ser::Savepoint::FromJSON(Savepoint *this,JSONNode *node)

{
  internalJSONNode *piVar1;
  pointer pcVar2;
  JSONNode *pJVar3;
  JSONNode **ppJVar4;
  JSONNode **ppJVar5;
  bool bVar6;
  SerializationException exception;
  ostringstream ss;
  json_string local_1f8;
  MetainfoSet *local_1d0;
  char *local_1a8 [2];
  char local_198 [360];
  
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"__name","");
  pJVar3 = JSONNode::at(node,&local_1f8);
  piVar1 = pJVar3->internal;
  internalJSONNode::Fetch(piVar1);
  pcVar2 = (piVar1->_string)._M_dataplus._M_p;
  local_1a8[0] = local_198;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a8,pcVar2,pcVar2 + (piVar1->_string)._M_string_length);
  std::__cxx11::string::operator=((string *)this,(string *)local_1a8);
  if (local_1a8[0] != local_198) {
    operator_delete(local_1a8[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  local_1d0 = &this->metainfo_;
  MetainfoSet::Cleanup(local_1d0);
  piVar1 = node->internal;
  if ((piVar1->_type & 0xfe) == 4) {
    internalJSONNode::Fetch(piVar1);
    ppJVar5 = piVar1->Children->array;
  }
  else {
    ppJVar5 = (JSONNode **)0x0;
  }
  while( true ) {
    piVar1 = node->internal;
    if ((piVar1->_type & 0xfe) == 4) {
      internalJSONNode::Fetch(piVar1);
      ppJVar4 = piVar1->Children->array + piVar1->Children->mysize;
    }
    else {
      ppJVar4 = (JSONNode **)0x0;
    }
    if (ppJVar5 == ppJVar4) break;
    pcVar2 = ((*ppJVar5)->internal->_name)._M_dataplus._M_p;
    local_1a8[0] = local_198;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,pcVar2,pcVar2 + ((*ppJVar5)->internal->_name)._M_string_length);
    bVar6 = true;
    if (*local_1a8[0] == '_') {
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      pcVar2 = ((*ppJVar5)->internal->_name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,pcVar2,pcVar2 + ((*ppJVar5)->internal->_name)._M_string_length
                );
      bVar6 = local_1f8._M_dataplus._M_p[1] != '_';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p);
      }
    }
    if (local_1a8[0] != local_198) {
      operator_delete(local_1a8[0]);
    }
    if (bVar6) {
      MetainfoSet::AddNode(local_1d0,*ppJVar5);
    }
    ppJVar5 = ppJVar5 + 1;
  }
  return;
}

Assistant:

void Savepoint::FromJSON(const JSONNode& node)
{
    // Name
    try
    {
        name_ = node.at("__name").as_string();
    }
    catch(std::out_of_range&)
    {
        SerializationException exception;
        std::ostringstream ss;
        ss << "Error: Savepoint node does not have a name:\n"
           << node.write_formatted() << "\n";
        exception.Init(ss.str());
        throw exception;
    }

    // Metainfo
    // Nodes whose name starts with __ are skipped
    metainfo_.Cleanup();
    for (JSONNode::const_iterator iter = node.begin(); iter != node.end(); ++iter)
        if (!(iter->name()[0] == '_' && iter->name()[1] == '_'))
            metainfo_.AddNode(*iter);
}